

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O2

void Abc_NtkBddImplicationTest(void)

{
  DdNode **ppDVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  DdManager *unique;
  DdNode *pDVar5;
  DdNode *n;
  abctime aVar6;
  int iVar7;
  DdNode *n_00;
  bool bVar8;
  
  aVar4 = Abc_Clock();
  unique = Cudd_Init(200,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SIFT);
  n_00 = (DdNode *)((ulong)unique->one ^ 1);
  Cudd_Ref(n_00);
  iVar7 = 200;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    putchar(0x2e);
    ppDVar1 = unique->vars;
    iVar2 = rand();
    pDVar5 = ppDVar1[iVar2 % 200];
    ppDVar1 = unique->vars;
    iVar2 = rand();
    pDVar5 = Cudd_bddAnd(unique,pDVar5,ppDVar1[iVar2 % 200]);
    Cudd_Ref(pDVar5);
    n = Cudd_bddOr(unique,n_00,pDVar5);
    Cudd_Ref(n);
    Cudd_RecursiveDeref(unique,n_00);
    Cudd_RecursiveDeref(unique,pDVar5);
    n_00 = n;
  }
  uVar3 = Cudd_DagSize(n_00);
  printf("The BDD before = %d.\n",(ulong)uVar3);
  Cudd_ReduceHeap(unique,CUDD_REORDER_SIFT,1);
  uVar3 = Cudd_DagSize(n_00);
  iVar7 = 0x7a7849;
  printf("The BDD after  = %d.\n",(ulong)uVar3);
  Abc_Print(iVar7,"%s =","Time");
  aVar6 = Abc_Clock();
  Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar6 - aVar4) / 1000000.0);
  Cudd_RecursiveDeref(unique,n_00);
  Cudd_Quit(unique);
  return;
}

Assistant:

void Abc_NtkBddImplicationTest()
{
    DdManager * dd;
    DdNode * bImp, * bSum, * bTemp;
    int nVars = 200;
    int nImps = 200;
    int i;
    abctime clk;
clk = Abc_Clock();
    dd = Cudd_Init( nVars, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd, CUDD_REORDER_SIFT );
    bSum = b0;   Cudd_Ref( bSum );
    for ( i = 0; i < nImps; i++ )
    {
        printf( "." );
        bImp = Cudd_bddAnd( dd, dd->vars[rand()%nVars], dd->vars[rand()%nVars] );  Cudd_Ref( bImp );
        bSum = Cudd_bddOr( dd, bTemp = bSum, bImp );     Cudd_Ref( bSum );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bImp );
    }
    printf( "The BDD before = %d.\n", Cudd_DagSize(bSum) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SIFT, 1 );
    printf( "The BDD after  = %d.\n", Cudd_DagSize(bSum) );
ABC_PRT( "Time", Abc_Clock() - clk );
    Cudd_RecursiveDeref( dd, bSum );
    Cudd_Quit( dd );
}